

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

int decode(uint64_t *in,uint8_t *out,size_t l,uint64_t q)

{
  ulong uVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  
  if (out == (uint8_t *)0x0 || in == (uint64_t *)0x0) {
    return -1;
  }
  uVar4 = l >> 3;
  uVar1 = l & 7;
  for (lVar3 = 0; lVar3 != (uVar4 + 1) - (ulong)(uVar1 == 0); lVar3 = lVar3 + 1) {
    uVar6 = 8;
    if (l < 8) {
      uVar6 = l;
    }
    out[lVar3] = '\0';
    bVar2 = 7;
    bVar7 = 0;
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      bVar7 = bVar7 | (in[uVar5] <= q - (q >> 2) && q >> 2 <= in[uVar5]) << (bVar2 & 0x1f);
      out[lVar3] = bVar7;
      bVar2 = bVar2 - 1;
    }
    l = l - uVar5;
    in = in + 8;
  }
  return 0;
}

Assistant:

int decode(uint64_t in[], uint8_t out[], size_t l, uint64_t q) {
    if(in == NULL || out == NULL)
        return -1;

    // define thresholds
    uint64_t t1 = q/4;
    uint64_t t2 = q - q/4;

    // compute number of bytes
    size_t num_bytes = l/8;
    if(num_bytes * 8 != l)
        num_bytes++;

    // iterate over bytes and bits and decode input
    for(size_t by = 0; by < num_bytes; by++) {
        out[by] = 0;
        for(size_t bi = 0; bi < 8 && l > 0; bi++) {
            uint8_t val = (in[by*8+bi] < t1 || in[by*8+bi] > t2) ? 0 : 1;
            out[by] |= val << (7-bi);
            l--;
        }
    }

    return 0;
}